

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderingUtils.hpp
# Opt level: O1

void __thiscall
Kernel::MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::MultiSet
          (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *elems)

{
  tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  **pptVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar5;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar6;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> elem;
  IntegerConstantType n;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_90;
  __mpz_struct local_70;
  _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  local_60;
  
  ::Lib::
  Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
  ::Stack(&this->_elems,(long)elems->_cursor - (long)elems->_stack >> 5);
  pMVar5 = elems->_stack;
  pMVar6 = elems->_cursor;
  if (pMVar5 != pMVar6) {
    uVar4 = (long)pMVar6 - (long)pMVar5 >> 5;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pMVar5,pMVar6,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
              (pMVar5,pMVar6);
  }
  pMVar5 = elems->_stack;
  if (pMVar5 != elems->_cursor) {
    do {
      IntegerConstantType::IntegerConstantType(&local_90.numeral,&pMVar5->numeral);
      local_90.factors._id = (pMVar5->factors)._id;
      local_90.factors._ptr = (pMVar5->factors)._ptr;
      IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_70,1);
      pMVar6 = pMVar5;
      while ((pMVar5 = pMVar6 + 1, pMVar5 != elems->_cursor &&
             (pMVar6[1].factors._id == local_90.factors._id))) {
        iVar3 = mpz_cmp((__mpz_struct *)pMVar5,(__mpz_struct *)&local_90);
        if (iVar3 != 0) break;
        mpz_add_ui(&local_70,&local_70,1);
        pMVar6 = pMVar5;
      }
      std::
      _Tuple_impl<0ul,Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::IntegerConstantType>
      ::
      _Tuple_impl<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>&,Kernel::IntegerConstantType&,void>
                ((_Tuple_impl<0ul,Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::IntegerConstantType>
                  *)&local_60,&local_90,(IntegerConstantType *)&local_70);
      if ((this->_elems)._cursor == (this->_elems)._end) {
        ::Lib::
        Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
        ::expand(&this->_elems);
      }
      std::
      _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
      ::_Tuple_impl(&((this->_elems)._cursor)->
                     super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                    ,&local_60);
      pptVar1 = &(this->_elems)._cursor;
      *pptVar1 = *pptVar1 + 1;
      mpz_clear((__mpz_struct *)
                &local_60.
                 super__Head_base<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_false>
               );
      mpz_clear((__mpz_struct *)&local_60);
      mpz_clear(&local_70);
      mpz_clear((__mpz_struct *)&local_90);
    } while (pMVar5 != elems->_cursor);
  }
  return;
}

Assistant:

MultiSet(Stack<T> elems) 
      : _elems(elems.size()) 
    {
      std::sort(elems.begin(), elems.end());
      auto iter = elems.begin();
      while (iter != elems.end()) {
        auto elem = *iter++;
        auto n = IntegerConstantType(1);
        while (iter != elems.end() && *iter == elem) {
          ++n;
          iter++;
        }
        _elems.push(std::make_tuple(elem, n));
      }
    }